

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

int DnsStats::GetDnsName
              (uint8_t *packet,uint32_t length,uint32_t start,uint8_t *name,size_t name_max,
              size_t *name_length)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint length_00;
  uint32_t flags;
  uint32_t local_34;
  
  if (name_max == 0 || length <= start) {
    length = 0;
LAB_0015c399:
    uVar2 = 0;
    uVar7 = length;
LAB_0015c39b:
    name[uVar2] = '\0';
    *name_length = uVar2;
    return uVar7;
  }
  uVar2 = 0;
  uVar5 = start;
  uVar6 = 0;
  do {
    bVar1 = packet[uVar5];
    length_00 = (uint)bVar1;
    if (bVar1 == 0) {
      uVar7 = uVar5 + 1;
      if (uVar6 != 0) {
        uVar7 = uVar6;
      }
      goto LAB_0015c39b;
    }
    if ((~length_00 & 0xc0) == 0) {
      uVar4 = uVar5 + 2;
      uVar7 = length;
      if (length < uVar4) goto LAB_0015c39b;
      uVar5 = (uint)packet[uVar5 + 1] | (length_00 & 0x3f) << 8;
      if (uVar6 != 0) {
        uVar4 = uVar6;
      }
      uVar7 = uVar4;
      if (start <= uVar5) {
        uVar2 = 0;
        uVar7 = length;
        goto LAB_0015c39b;
      }
    }
    else {
      if (((0x3f < bVar1) || (length < uVar5 + length_00 + 1)) || (name_max < length_00 + uVar2 + 2)
         ) goto LAB_0015c399;
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else if (uVar2 + 1 < name_max) {
        name[uVar2] = '.';
        uVar2 = uVar2 + 1;
      }
      sVar3 = NormalizeNamePart(length_00,packet + (uVar5 + 1),name + uVar2,name_max - uVar2,
                                &local_34);
      uVar2 = sVar3 + uVar2;
      uVar5 = uVar5 + length_00 + 1;
      uVar7 = uVar6;
    }
    if ((length <= uVar5) || (uVar6 = uVar7, name_max <= uVar2)) goto LAB_0015c39b;
  } while( true );
}

Assistant:

int DnsStats::GetDnsName(uint8_t * packet, uint32_t length, uint32_t start,
    uint8_t * name, size_t name_max, size_t * name_length)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t start_next = 0;
    size_t name_index = 0;

    while (start <length && name_index < name_max) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;

            if (start_next == 0) {
                start_next = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start_next = length;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    if (start_next == 0) {
                        start_next = start + 2;
                    }
                    start = new_start;
                } else {
                    /* Basic restriction to avoid name decoding loops */
                    name_index = 0;
                    start_next = length;
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            name_index = 0;
            start_next = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length ||
                name_index + l + 2 > name_max)
            {
                /* format error */
                name_index = 0;
                start_next = length;
                break;
            }
            else
            {
                uint32_t flags;
                if (name_index > 0 && name_index+1 < name_max) {
                    name[name_index++] = '.';
                }

                name_index += NormalizeNamePart(l, &packet[start + 1], name + name_index, name_max - name_index, &flags);

                start += l + 1; 
            }
        }
    }

    name[name_index] = 0;

    *name_length = name_index;

    return start_next;
}